

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWISimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
AtmelSWISimulationDataGenerator::GenerateSimulationData
          (AtmelSWISimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  SimulationChannelDescriptor *pSVar4;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  while (uVar3 < uVar2) {
    CreateSWITransaction(this,CheckMacBlockSent,CheckMacBlockReceived);
    CreateSWITransaction(this,DeriveKeyBlockSent,DeriveKeyBlockReceived);
    CreateSWITransaction(this,DevRevBlockSent,DevRevBlockReceived);
    CreateSWITransaction(this,GenDigBlockSent,GenDigBlockReceived);
    CreateSWITransaction(this,HMACBlockSent,HMACBlockReceived);
    CreateSWITransaction(this,LockBlockSent,LockBlockReceived);
    CreateSWITransaction(this,MacBlockSent,MacBlockReceived);
    CreateSWITransaction(this,NonceBlockSent,NonceBlockReceived);
    CreateSWITransaction(this,PauseBlockSent,PauseBlockReceived);
    CreateSWITransaction(this,RandomBlockSent,RandomBlockReceived);
    CreateSWITransaction(this,ReadBlockSent,ReadBlockReceived);
    CreateSWITransaction(this,ReadBlockSent,ReadBlockReceived);
    CreateSWITransaction(this,UpdateExtraBlockSent,UpdateExtraBlockReceived);
    CreateSWITransaction(this,WriteBlockSent,WriteBlockReceived);
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  }
  pSVar4 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar4;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 AtmelSWISimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                             SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mSDA->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateSWITransaction( CheckMacBlockSent, CheckMacBlockReceived );
        CreateSWITransaction( DeriveKeyBlockSent, DeriveKeyBlockReceived );
        CreateSWITransaction( DevRevBlockSent, DevRevBlockReceived );
        CreateSWITransaction( GenDigBlockSent, GenDigBlockReceived );
        CreateSWITransaction( HMACBlockSent, HMACBlockReceived );
        CreateSWITransaction( LockBlockSent, LockBlockReceived );
        CreateSWITransaction( MacBlockSent, MacBlockReceived );
        CreateSWITransaction( NonceBlockSent, NonceBlockReceived );
        CreateSWITransaction( PauseBlockSent, PauseBlockReceived );
        CreateSWITransaction( RandomBlockSent, RandomBlockReceived );
        CreateSWITransaction( ReadBlockSent, ReadBlockReceived );
        CreateSWITransaction( ReadBlockSent, ReadBlockReceived );
        CreateSWITransaction( UpdateExtraBlockSent, UpdateExtraBlockReceived );
        CreateSWITransaction( WriteBlockSent, WriteBlockReceived );
    }

    *simulation_channels = mSWISimulationChannels.GetArray();

    return mSWISimulationChannels.GetCount();
}